

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall
VertexAttrib64Bit::LimitTest::prepareVertexArray
          (LimitTest *this,_iteration iteration,_attributeType attribute_type,GLuint program_id,
          bool use_arrays)

{
  GLint GVar1;
  GLenum GVar2;
  int n_type;
  GLuint GVar3;
  attributeConfiguration configuration;
  attributeConfiguration local_60;
  
  (*(this->super_Base).gl.getIntegerv)(0x8869,&local_60.m_n_attributes_per_group);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xb9);
  GVar1 = local_60.m_n_attributes_per_group;
  GVar3 = 0;
  local_60.m_n_attributes_per_group = 0;
  local_60.m_type_names = (GLchar **)0x0;
  local_60.m_vertex_length = 0;
  local_60.m_n_elements = (GLint *)0x0;
  local_60.m_n_rows = (GLint *)0x0;
  local_60.m_n_types = 0;
  getVertexArrayConfiguration(this,iteration,&local_60);
  if (0 < GVar1) {
    do {
      (*(this->super_Base).gl.vertexAttribDivisor)(GVar3,(uint)(attribute_type == PER_INSTANCE));
      GVar2 = (*(this->super_Base).gl.getError)();
      glu::checkError(GVar2,"VertexAttribDivisor",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                      ,0x917);
      (*(this->super_Base).gl.disableVertexAttribArray)(GVar3);
      GVar2 = (*(this->super_Base).gl.getError)();
      glu::checkError(GVar2,"DisableVertexAttribArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                      ,0x91a);
      GVar3 = GVar3 + 1;
    } while (GVar1 != GVar3);
  }
  GVar1 = local_60.m_n_types;
  if (0 < local_60.m_n_types) {
    n_type = 0;
    do {
      configureAttribute(this,iteration,&local_60,n_type,program_id,use_arrays,
                         attribute_type != CONSTANT);
      n_type = n_type + 1;
    } while (GVar1 != n_type);
  }
  return;
}

Assistant:

void LimitTest::prepareVertexArray(_iteration iteration, _attributeType attribute_type, GLuint program_id,
								   bool use_arrays) const
{
	const GLint  max_vertex_attribs	= GetMaxVertexAttribs();
	const GLuint vertex_attrib_divisor = (PER_INSTANCE == attribute_type) ? 1 : 0;

	attributeConfiguration configuration;

	getVertexArrayConfiguration(iteration, configuration);

	/* Set vertex attributes divisor and disable */
	for (GLint i = 0; i < max_vertex_attribs; ++i)
	{
		gl.vertexAttribDivisor(i, vertex_attrib_divisor);
		GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribDivisor");

		gl.disableVertexAttribArray(i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DisableVertexAttribArray");
	}

	for (GLint n_type = 0; n_type < configuration.m_n_types; ++n_type)
	{
		configureAttribute(iteration, configuration, n_type, program_id, use_arrays, (CONSTANT != attribute_type));
	}
}